

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_realloc(void *msp,void *ptr,size_t nsize)

{
  mchunkptr pmVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  bool bVar5;
  size_t oc;
  void *newmem;
  mchunkptr newtop;
  size_t newtopsize;
  size_t newsize;
  mchunkptr rem;
  size_t rsize;
  size_t nb;
  mchunkptr newp;
  mchunkptr next;
  size_t oldsize;
  mchunkptr oldp;
  mstate m;
  void *in_stack_000000b8;
  void *in_stack_000000c0;
  size_t local_b8;
  ulong local_90;
  size_t in_stack_ffffffffffffff80;
  mchunkptr in_stack_ffffffffffffff88;
  mchunkptr local_48;
  malloc_chunk **local_8;
  
  if (in_RDX < 0xffffffffffffff80) {
    pmVar1 = (mchunkptr)((long)in_RSI + -0x10);
    uVar2 = *(ulong *)((long)in_RSI + -8) & 0xfffffffffffffffc;
    local_48 = (mchunkptr)0x0;
    if (in_RDX < 0x17) {
      local_90 = 0x20;
    }
    else {
      local_90 = in_RDX + 0xf & 0xfffffffffffffff8;
    }
    if (((*(ulong *)((long)in_RSI + -8) & 1) == 0) && ((pmVar1->prev_foot & 1) != 0)) {
      local_48 = direct_resize(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    else if (uVar2 < local_90) {
      if (((long)&pmVar1->prev_foot + uVar2 == *(long *)(in_RDI + 0x20)) &&
         (local_90 < uVar2 + *(long *)(in_RDI + 0x10))) {
        uVar3 = (uVar2 + *(long *)(in_RDI + 0x10)) - local_90;
        lVar4 = (long)&pmVar1->prev_foot + local_90;
        *(ulong *)((long)in_RSI + -8) = *(ulong *)((long)in_RSI + -8) & 1 | local_90 | 2;
        *(ulong *)((long)in_RSI + (local_90 - 8)) = *(ulong *)((long)in_RSI + (local_90 - 8)) | 1;
        *(ulong *)(lVar4 + 8) = uVar3 | 1;
        *(long *)(in_RDI + 0x20) = lVar4;
        *(ulong *)(in_RDI + 0x10) = uVar3;
        local_48 = pmVar1;
      }
    }
    else {
      uVar3 = uVar2 - local_90;
      local_48 = pmVar1;
      if (0x1f < uVar3) {
        *(ulong *)((long)in_RSI + -8) = *(ulong *)((long)in_RSI + -8) & 1 | local_90 | 2;
        *(ulong *)((long)in_RSI + (local_90 - 8)) = *(ulong *)((long)in_RSI + (local_90 - 8)) | 1;
        *(ulong *)((long)&pmVar1->head + local_90) =
             *(ulong *)((long)&pmVar1->head + local_90) & 1 | uVar3 | 2;
        *(ulong *)((long)pmVar1 + uVar3 + local_90 + 8) =
             *(ulong *)((long)pmVar1 + uVar3 + local_90 + 8) | 1;
        lj_alloc_free(in_stack_000000c0,in_stack_000000b8);
      }
    }
    if (local_48 == (mchunkptr)0x0) {
      local_8 = (malloc_chunk **)lj_alloc_malloc(newmem,oc);
      if (local_8 != (malloc_chunk **)0x0) {
        bVar5 = false;
        if ((*(ulong *)((long)in_RSI + -8) & 1) == 0) {
          bVar5 = (pmVar1->prev_foot & 1) != 0;
        }
        lVar4 = 8;
        if (bVar5) {
          lVar4 = 0x10;
        }
        local_b8 = in_RDX;
        if (uVar2 - lVar4 < in_RDX) {
          local_b8 = uVar2 - lVar4;
        }
        memcpy(local_8,in_RSI,local_b8);
        lj_alloc_free(in_stack_000000c0,in_stack_000000b8);
      }
    }
    else {
      local_8 = &local_48->fd;
    }
  }
  else {
    local_8 = (malloc_chunk **)0x0;
  }
  return local_8;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_realloc(void *msp, void *ptr, size_t nsize)
{
  if (nsize >= MAX_REQUEST) {
    return NULL;
  } else {
    mstate m = (mstate)msp;
    mchunkptr oldp = mem2chunk(ptr);
    size_t oldsize = chunksize(oldp);
    mchunkptr next = chunk_plus_offset(oldp, oldsize);
    mchunkptr newp = 0;
    size_t nb = request2size(nsize);

    /* Try to either shrink or extend into top. Else malloc-copy-free */
    if (is_direct(oldp)) {
      newp = direct_resize(oldp, nb);  /* this may return NULL. */
    } else if (oldsize >= nb) { /* already big enough */
      size_t rsize = oldsize - nb;
      newp = oldp;
      if (rsize >= MIN_CHUNK_SIZE) {
	mchunkptr rem = chunk_plus_offset(newp, nb);
	set_inuse(m, newp, nb);
	set_inuse(m, rem, rsize);
	lj_alloc_free(m, chunk2mem(rem));
      }
    } else if (next == m->top && oldsize + m->topsize > nb) {
      /* Expand into top */
      size_t newsize = oldsize + m->topsize;
      size_t newtopsize = newsize - nb;
      mchunkptr newtop = chunk_plus_offset(oldp, nb);
      set_inuse(m, oldp, nb);
      newtop->head = newtopsize |PINUSE_BIT;
      m->top = newtop;
      m->topsize = newtopsize;
      newp = oldp;
    }

    if (newp != 0) {
      return chunk2mem(newp);
    } else {
      void *newmem = lj_alloc_malloc(m, nsize);
      if (newmem != 0) {
	size_t oc = oldsize - overhead_for(oldp);
	memcpy(newmem, ptr, oc < nsize ? oc : nsize);
	lj_alloc_free(m, ptr);
      }
      return newmem;
    }
  }
}